

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O2

uint16_t gpio_read(uint32_t address)

{
  gpio_port_t gVar1;
  byte bVar2;
  uint uVar3;
  
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] [GPIO] gpio read from address 0x%08X\n",address);
  }
  if (bus->allow_gpio_read == true) {
    uVar3 = address & 0xf;
    if (uVar3 == 8) {
      bVar2 = 1;
      goto LAB_0011ca0c;
    }
    if (uVar3 == 6) {
      bVar2 = bus->gpio_write_mask;
      goto LAB_0011ca0c;
    }
    if (uVar3 == 4) {
      if (bus->gpio_device != RTC) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/gpio.c"
                ,0x13);
        fprintf(_stderr,"Read from data port for unimplemented device %d\n\x1b[0;m",
                (ulong)bus->gpio_device);
        exit(1);
      }
      gVar1 = gba_rtc_read();
      bVar2 = gVar1.raw & bus->gpio_read_mask;
      goto LAB_0011ca0c;
    }
  }
  bVar2 = 0;
LAB_0011ca0c:
  return (uint16_t)bVar2;
}

Assistant:

half gpio_read(word address) {
    logdebug("[GPIO] gpio read from address 0x%08X", address);
    if (bus->allow_gpio_read) {
        switch (address & 0xF) {
            case 0x4: // Data
                switch (bus->gpio_device) {
                    case RTC: {
                        gpio_port_t port = gba_rtc_read();
                        return bus->gpio_read_mask & port.raw;
                    }
                    default:
                        logfatal("Read from data port for unimplemented device %d", bus->gpio_device)
                }
                break;
            case 0x6:
                return bus->gpio_write_mask;
            case 0x8:
                return bus->allow_gpio_read & 1;
        }
    }
    return 0;
}